

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gym_Emu.cpp
# Opt level: O0

void __thiscall Gym_Emu::set_tempo_(Gym_Emu *this,double t)

{
  long lVar1;
  Music_Emu *in_RDI;
  Dual_Resampler *in_XMM0_Qa;
  double dVar2;
  
  if (0.25 <= (double)in_XMM0_Qa) {
    lVar1 = Blip_Buffer::sample_rate
                      ((Blip_Buffer *)&in_RDI[4].super_Gme_File.playlist.info_.tagging);
    if (lVar1 != 0) {
      dVar2 = Music_Emu::tempo(in_RDI);
      *(int *)&in_RDI[4].super_Gme_File.playlist.info_.engineer = (int)(long)(59667.0 / dVar2);
      Music_Emu::sample_rate(in_RDI);
      Music_Emu::tempo(in_RDI);
      Dual_Resampler::resize(in_XMM0_Qa,(int)((ulong)in_RDI >> 0x20));
    }
  }
  else {
    Music_Emu::set_tempo((Music_Emu *)in_XMM0_Qa,(double)in_RDI);
  }
  return;
}

Assistant:

void Gym_Emu::set_tempo_( double t )
{
	if ( t < min_tempo )
	{
		set_tempo( min_tempo );
		return;
	}
	
	if ( blip_buf.sample_rate() )
	{
		clocks_per_frame = long (clock_rate / 60 / tempo());
		Dual_Resampler::resize( long (sample_rate() / (60.0 * tempo())) );
	}
}